

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmTextureCalc::GetDisplayFrameOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_DISPLAY_FRAME GVar1;
  uint32_t local_2c;
  uint32_t Offset;
  GMM_REQ_OFFSET_INFO *pReqInfo_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = 1;
  }
  else if (pReqInfo == (GMM_REQ_OFFSET_INFO *)0x0) {
    this_local._4_4_ = 1;
  }
  else {
    GVar1 = pReqInfo->Frame;
    if (GVar1 == GMM_DISPLAY_BASE) {
      local_2c = 0;
    }
    else if (GVar1 == GMM_DISPLAY_R) {
      local_2c = (pTexInfo->S3d).RFrameOffset;
    }
    else if (GVar1 == GMM_DISPLAY_BLANK_AREA) {
      local_2c = (pTexInfo->S3d).BlankAreaOffset;
    }
    else {
      local_2c = 0;
    }
    this_local._4_4_ = local_2c;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t GmmLib::GmmTextureCalc::GetDisplayFrameOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                       GMM_REQ_OFFSET_INFO *pReqInfo)
{
    uint32_t Offset;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);

    switch(pReqInfo->Frame)
    {
        case GMM_DISPLAY_L:
            Offset = 0;
            break;
        case GMM_DISPLAY_R:
            Offset = pTexInfo->S3d.RFrameOffset;
            break;
        case GMM_DISPLAY_BLANK_AREA:
            Offset = pTexInfo->S3d.BlankAreaOffset;
            break;
        default:
            Offset = 0;
            GMM_ASSERTDPF(0, "Unknown Frame Type!");
            break;
    }

    return Offset;
}